

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<float>::copyFromArray
          (btAlignedObjectArray<float> *this,btAlignedObjectArray<float> *otherArray)

{
  uint uVar1;
  btAlignedObjectArray<float> *in_RSI;
  undefined8 in_RDI;
  int newsize;
  btAlignedObjectArray<float> *unaff_retaddr;
  int otherSize;
  
  newsize = (int)((ulong)in_RDI >> 0x20);
  uVar1 = size(in_RSI);
  resize(unaff_retaddr,newsize,(float *)in_RSI);
  copy(in_RSI,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)(ulong)uVar1);
  return;
}

Assistant:

void copyFromArray(const btAlignedObjectArray& otherArray)
	{
		int otherSize = otherArray.size();
		resize (otherSize);
		otherArray.copy(0, otherSize, m_data);
	}